

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_InvalidErrorFormat_Test::
~CommandLineInterfaceTest_InvalidErrorFormat_Test
          (CommandLineInterfaceTest_InvalidErrorFormat_Test *this)

{
  CommandLineInterfaceTest_InvalidErrorFormat_Test *this_local;
  
  ~CommandLineInterfaceTest_InvalidErrorFormat_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, InvalidErrorFormat) {
  // Test invalid --error_format

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "badsyntax\n");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir --error_format=invalid foo.proto");

  ExpectErrorText("Unknown error format: invalid\n");
}